

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O2

double __thiscall
phmap::priv::anon_unknown_0::ProbeStats::PercentileRatio(ProbeStats *this,double Percentile)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __nth;
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  vector<double,_std::allocator<double>_> r;
  _Vector_base<double,_std::allocator<double>_> local_28;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_28,&this->single_table_ratios);
  lVar1 = (long)local_28._M_impl.super__Vector_impl_data._M_finish -
          (long)local_28._M_impl.super__Vector_impl_data._M_start >> 3;
  auVar3._8_4_ = (int)((long)local_28._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_28._M_impl.super__Vector_impl_data._M_start >> 0x23);
  auVar3._0_8_ = lVar1;
  auVar3._12_4_ = 0x45300000;
  dVar4 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * Percentile;
  uVar2 = (ulong)dVar4;
  __nth._M_current =
       local_28._M_impl.super__Vector_impl_data._M_start +
       ((long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2);
  if (__nth._M_current == local_28._M_impl.super__Vector_impl_data._M_finish) {
    dVar4 = MaxRatio(this);
  }
  else {
    std::
    nth_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               local_28._M_impl.super__Vector_impl_data._M_start,__nth,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               local_28._M_impl.super__Vector_impl_data._M_finish);
    dVar4 = *__nth._M_current;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
  return dVar4;
}

Assistant:

double PercentileRatio(double Percentile = 0.95) const {
    auto r = single_table_ratios;
    auto mid = r.begin() + static_cast<size_t>(r.size() * Percentile);
    if (mid != r.end()) {
      std::nth_element(r.begin(), mid, r.end());
      return *mid;
    } else {
      return MaxRatio();
    }
  }